

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::Expand<char>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  CrtAllocator *pCVar1;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  Stack<rapidjson::CrtAllocator> *unaff_retaddr;
  size_t newSize;
  size_t newCapacity;
  Stack<rapidjson::CrtAllocator> *pSVar2;
  
  pSVar2 = in_RDI;
  if (in_RDI->stack_ == (char *)0x0) {
    if (in_RDI->allocator_ == (CrtAllocator *)0x0) {
      pCVar1 = (CrtAllocator *)operator_new(1);
      in_RDI->allocator_ = pCVar1;
      in_RDI->ownAllocator_ = pCVar1;
    }
  }
  else {
    GetCapacity(in_RDI);
  }
  GetSize(in_RDI);
  Resize(unaff_retaddr,(size_t)pSVar2);
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator());
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }